

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

bool __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::rd_string
          (uintwide_t<256U,_unsigned_short,_void,_true> *this,char *str_input,
          unsigned_fast_type count,int base_hint)

{
  byte bVar1;
  long lVar2;
  uint8_t uc_oct;
  byte bVar3;
  bool bVar4;
  ulong uVar5;
  bool bVar6;
  uintwide_t<256U,_unsigned_short,_void,_true> local_50;
  
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 2) {
    *(undefined2 *)((long)(this->values).super_array<unsigned_short,_16UL>.elems + lVar2) = 0;
  }
  if (count == 0xffffffffffffffff) {
    count = detail::strlen_unsafe(str_input);
  }
  if (count == 0) {
    if ((char)base_hint == '\0') {
      base_hint = 10;
    }
    bVar6 = false;
    uVar5 = 0;
  }
  else {
    bVar6 = *str_input == '-';
    uVar5 = (ulong)(*str_input == '+' || bVar6);
    if ((char)base_hint == '\0') {
      base_hint = 10;
      if (uVar5 < count) {
        if (str_input[uVar5] == '0') {
          if ((byte)(str_input[uVar5 + 1] - 0x30U) < 9) {
            uVar5 = uVar5 + 1;
            base_hint = 8;
          }
          else if ((byte)(str_input[uVar5 + 1] | 0x20U) == 0x78) {
            uVar5 = uVar5 | 2;
            base_hint = 0x10;
          }
        }
      }
      else {
        uVar5 = 1;
      }
    }
  }
  bVar4 = true;
  do {
    if ((count <= uVar5) || (!bVar4)) {
      if (bVar6) {
        negate(this);
      }
      return bVar4;
    }
    bVar1 = str_input[uVar5];
    bVar4 = true;
    if (bVar1 != 0x27) {
      if ((char)base_hint == '\x10') {
        bVar3 = bVar1 - 0x30;
        bVar4 = (bVar3 < 10 || (byte)(bVar1 + 0xbf) < 6) || (byte)(bVar1 + 0x9f) < 6;
        if ((bVar3 < 10) ||
           ((bVar1 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) != 0))))
        {
          if ((byte)(bVar1 + 0x9f) < 6) {
            bVar3 = bVar1 + 0xa9;
          }
          else if ((byte)(bVar1 + 0xbf) < 6) {
            bVar3 = bVar1 - 0x37;
          }
          else if (9 < bVar3) {
            bVar3 = 0;
          }
          uintwide_t<256u,unsigned_short,void,true>::operator<<=
                    ((uintwide_t<256u,unsigned_short,void,true> *)this,4);
          (this->values).super_array<unsigned_short,_16UL>.elems[0] =
               (this->values).super_array<unsigned_short,_16UL>.elems[0] | (ushort)bVar3;
        }
      }
      else if ((base_hint & 0xffU) == 10) {
        if ((byte)(bVar1 - 0x30) < 10) {
          mul_by_limb(this,10);
          uintwide_t<256u,unsigned_short,void,true>::uintwide_t<unsigned_char>(unsigned_char,std::
          enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
          value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_short>::
          digits),void>::type__
                    (&local_50,bVar1 - 0x30,
                     (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                      *)0x0);
          operator+=(this,&local_50);
        }
        else {
LAB_0011f836:
          bVar4 = false;
        }
      }
      else if ((base_hint & 0xffU) == 8) {
        if (8 < (byte)(bVar1 - 0x30)) goto LAB_0011f836;
        uintwide_t<256u,unsigned_short,void,true>::operator<<=
                  ((uintwide_t<256u,unsigned_short,void,true> *)this,3);
        (this->values).super_array<unsigned_short,_16UL>.elems[0] =
             (this->values).super_array<unsigned_short,_16UL>.elems[0] |
             (ushort)(byte)(bVar1 - 0x30);
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

constexpr auto rd_string(const char* str_input, const unsigned_fast_type count, const int base_hint) -> bool // NOLINT(readability-function-cognitive-complexity,bugprone-easily-swappable-parameters)
    {
      detail::fill_unsafe(values.begin(), values.end(), static_cast<limb_type>(UINT8_C(0)));

      const auto str_length =
        static_cast<unsigned_fast_type>
        (
          (count == (std::numeric_limits<unsigned_fast_type>::max)()) ? detail::strlen_unsafe(str_input) : count
        );

      auto pos = static_cast<unsigned_fast_type>(UINT8_C(0));

      // Detect: Is there a plus sign?
      // And if there is a plus sign, skip over the plus sign.
      if((str_length > static_cast<unsigned_fast_type>(UINT8_C(0))) && (str_input[static_cast<std::size_t>(UINT8_C(0))] == '+')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
      {
        ++pos;
      }

      auto str_has_neg_sign = false;

      // Detect: Is there a minus sign?
      // And if there is a minus sign, skip over the minus sign.
      if((str_length > static_cast<unsigned_fast_type>(UINT8_C(0))) && (str_input[static_cast<std::size_t>(UINT8_C(0))] == '-')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
      {
        str_has_neg_sign = true;

        ++pos;
      }

      // Set the base if the client has supplied a non-zero base-hint.
      auto base = static_cast<std::uint_fast8_t>(base_hint);

      if(base == static_cast<std::uint_fast8_t>(UINT8_C(0)))
      {
        base = static_cast<std::uint_fast8_t>(UINT8_C(10));

        // Perform a dynamic detection of the base.
        if(str_length > static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0))))
        {
          const auto might_be_oct_or_hex = ((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0)))] == '0') && (str_length > static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0))))); // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)

          if(might_be_oct_or_hex)
          {
            if((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] >= '0') && (str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] <= '8')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
            {
              // The input format is octal.
              base = static_cast<std::uint_fast8_t>(UINT8_C(8));

              pos = static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)));
            }
            else if((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] == 'x') || (str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] == 'X')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
            {
              // The input format is hexadecimal.
              base = static_cast<std::uint_fast8_t>(UINT8_C(16));

              pos = static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(2)));
            }
          }
          else if((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0)))] >= '0') && (str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0)))] <= '9')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
          {
            // The input format is decimal.
            ;
          }
        }
      }

      auto char_is_valid = true;

      while((pos < str_length) && char_is_valid) // NOLINT(altera-id-dependent-backward-branch)
      {
        const auto c = str_input[pos++]; // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)

        const auto char_is_apostrophe = (c == static_cast<char>(39));

        if(!char_is_apostrophe)
        {
          if(base == static_cast<std::uint_fast8_t>(UINT8_C(8)))
          {
            char_is_valid = ((c >= '0') && (c <= '8'));

            if(char_is_valid)
            {
              const auto uc_oct = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(0x30)));

              static_cast<void>(operator<<=(static_cast<unsigned>(UINT8_C(3))));

              *values.begin() = static_cast<limb_type>(*values.begin() | uc_oct);
            }
          }
          else if(base == static_cast<std::uint_fast8_t>(UINT8_C(10)))
          {
            char_is_valid = ((c >= '0') && (c <= '9'));

            if(char_is_valid)
            {
              const auto uc_dec = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(0x30)));

              static_cast<void>(mul_by_limb(static_cast<limb_type>(UINT8_C(10))));

              static_cast<void>(operator+=(uc_dec));
            }
          }
          else if(base == static_cast<std::uint_fast8_t>(UINT8_C(16)))
          {
            const auto char_is_a_to_f_lo((c >= 'a') && (c <= 'f'));
            const auto char_is_a_to_f_hi((c >= 'A') && (c <= 'F'));
            const auto char_is_0_to_9   ((c >= '0') && (c <= '9'));

            char_is_valid = (char_is_a_to_f_lo || char_is_a_to_f_hi || char_is_0_to_9);

            if(char_is_valid)
            {
              auto uc_hex = static_cast<std::uint8_t>(UINT8_C(0));

              if     (char_is_a_to_f_lo) { uc_hex = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(  87))); }
              else if(char_is_a_to_f_hi) { uc_hex = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(  55))); }
              else if(char_is_0_to_9)    { uc_hex = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(0x30))); }

              static_cast<void>(operator<<=(static_cast<unsigned>(UINT8_C(4))));

              *values.begin() = static_cast<limb_type>(*values.begin() | uc_hex);
            }
          }
        }
      }

      if(str_has_neg_sign)
      {
        // Exclude this line from code coverage, even though explicit
        // test cases (search for "result_overshift_is_ok") are known
        // to cover this line.
        negate(); // LCOV_EXCL_LINE
      }

      return char_is_valid;
    }